

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_set_sig_bytes(png_structrp png_ptr,int num_bytes)

{
  int iVar1;
  uint nb;
  
  if (png_ptr != (png_structrp)0x0) {
    if (8 < num_bytes) {
      png_error(png_ptr,"Too many bytes for PNG signature");
    }
    iVar1 = 0;
    if (0 < num_bytes) {
      iVar1 = num_bytes;
    }
    png_ptr->sig_bytes = (png_byte)iVar1;
  }
  return;
}

Assistant:

void PNGAPI
png_set_sig_bytes(png_structrp png_ptr, int num_bytes)
{
   unsigned int nb = (unsigned int)num_bytes;

   png_debug(1, "in png_set_sig_bytes");

   if (png_ptr == NULL)
      return;

   if (num_bytes < 0)
      nb = 0;

   if (nb > 8)
      png_error(png_ptr, "Too many bytes for PNG signature");

   png_ptr->sig_bytes = (png_byte)nb;
}